

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O2

void __thiscall ON_RenderContentPrivate::SetXMLNode(ON_RenderContentPrivate *this,ON_XMLNode *node)

{
  bool bVar1;
  int iVar2;
  ON_XMLNode *pOVar3;
  undefined4 extraout_var;
  ON_RenderContent *pOVar4;
  wchar_t *component_name;
  ON_wString name;
  ChildIterator it;
  ON_XMLNode node_copy;
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  ON_UUID local_220;
  ON_XMLVariant local_210;
  ON_XMLNode local_118;
  ON_wString *rhs;
  
  local_240._8_8_ = &this->m_mutex;
  std::recursive_mutex::lock((recursive_mutex *)local_240._8_8_);
  ON_XMLNode::ON_XMLNode(&local_118,node);
  ON_XMLNode::GetChildIterator((ON_XMLNode *)local_230);
  do {
    pOVar3 = ON_XMLNode::ChildIterator::GetNextChild((ChildIterator *)local_230);
    if (pOVar3 == (ON_XMLNode *)0x0) {
      ON_XMLNode::operator=(&this->m_node,&local_118);
      GetPropertyValue(&local_210,this,L"instance-name");
      ::ON_XMLVariant::AsString((ON_XMLVariant *)local_240);
      ::ON_XMLVariant::~ON_XMLVariant(&local_210);
      bVar1 = ON_ModelComponent::IsValidComponentName((ON_wString *)local_240);
      if (!bVar1) {
        EnsureNameValid((ON_wString *)local_240);
      }
      pOVar4 = this->m_render_content;
      component_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_240);
      ON_ModelComponent::SetName(&pOVar4->super_ON_ModelComponent,component_name);
      pOVar4 = this->m_render_content;
      GetPropertyValue(&local_210,this,L"instance-id");
      local_220 = ::ON_XMLVariant::AsUuid(&local_210);
      ON_ModelComponent::SetId(&pOVar4->super_ON_ModelComponent,&local_220);
      ::ON_XMLVariant::~ON_XMLVariant(&local_210);
      ON_wString::~ON_wString((ON_wString *)local_240);
      ON_XMLNode::ChildIterator::~ChildIterator((ChildIterator *)local_230);
      ON_XMLRootNode::~ON_XMLRootNode((ON_XMLRootNode *)&local_118);
      pthread_mutex_unlock((pthread_mutex_t *)local_240._8_8_);
      return;
    }
    iVar2 = (*pOVar3->_vptr_ON_XMLNode[3])(pOVar3);
    rhs = (ON_wString *)CONCAT44(extraout_var,iVar2);
    bVar1 = ::operator==(L"material",rhs);
    if (bVar1) goto LAB_005a427f;
    bVar1 = ::operator==(L"environment",rhs);
    if (bVar1) goto LAB_005a427f;
    bVar1 = ::operator==(L"texture",rhs);
    if (bVar1) {
LAB_005a427f:
      pOVar4 = NewRenderContentFromNode(pOVar3);
      if (pOVar4 != (ON_RenderContent *)0x0) {
        AddChild(this,pOVar4);
      }
      pOVar3 = ON_XMLNode::DetachChild(&local_118,pOVar3);
      if (pOVar3 != (ON_XMLNode *)0x0) {
        (*pOVar3->_vptr_ON_XMLNode[1])(pOVar3);
      }
    }
  } while( true );
}

Assistant:

void ON_RenderContentPrivate::SetXMLNode(const ON_XMLNode& node)
{
  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  // Copy the incoming XML node. The render content will only store a copy of its own XML, so
  // we will have to prune this copy as we find children and create render content children
  // for all the XML children.
  ON_XMLNode node_copy = node;

  // Iterate over the child nodes of the XML node being set to this content.
  auto it = node_copy.GetChildIterator();
  ON_XMLNode* child_node = nullptr;
  while (nullptr != (child_node = it.GetNextChild()))
  {
    // See if the child node is a content node.
    const ON_wString& name = child_node->TagName();
    if ((ON_KIND_MATERIAL == name) || (ON_KIND_ENVIRONMENT == name) || (ON_KIND_TEXTURE == name))
    {
      // Yes, so we are going to add a new render content to this hierarchy (recursively)
      // and remove this child node from the copy of the XML node.
      ON_RenderContent* child_rc = NewRenderContentFromNode(*child_node);
      if (nullptr != child_rc)
      {
        // Add the new content as a child of this content.
        AddChild(*child_rc);
      }

      delete node_copy.DetachChild(*child_node);
    }
  }

  // Copy the pruned copy of the XML node. This node does not have any child content nodes.
  m_node = node_copy;

  // Copy the XML instance name to the component name after validating it.
  ON_wString name = GetPropertyValue(ON_RENDER_CONTENT_INSTANCE_NAME).AsString();

  // 29th November 2023 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH-78603
  if (!ON_ModelComponent::IsValidComponentName(name))
  {
    EnsureNameValid(name);
  }

  m_render_content.SetName(name);

  // Copy the XML instance id to the component id.
  m_render_content.SetId(GetPropertyValue(ON_RENDER_CONTENT_INSTANCE_ID).AsUuid());
}